

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.hpp
# Opt level: O0

void __thiscall
mir::inst::Variable::Variable
          (Variable *this,SharedTyPtr *ty,bool is_memory_var,bool is_temp_var,bool is_phi_var)

{
  byte in_CL;
  byte in_DL;
  shared_ptr<mir::types::Ty> *in_RSI;
  shared_ptr<mir::types::Ty> *in_RDI;
  byte in_R8B;
  
  prelude::Displayable::Displayable((Displayable *)in_RDI);
  (in_RDI->super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)&PTR_display_0036ffc0;
  std::shared_ptr<mir::types::Ty>::shared_ptr(in_RDI,in_RSI);
  *(byte *)&in_RDI[1].super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = in_DL & 1;
  *(byte *)((long)&in_RDI[1].super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi + 1) = in_CL & 1;
  *(byte *)((long)&in_RDI[1].super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi + 2) = in_R8B & 1;
  *(undefined4 *)
   ((long)&in_RDI[1].super___shared_ptr<mir::types::Ty,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi + 4) = 0;
  return;
}

Assistant:

Variable(types::SharedTyPtr ty, bool is_memory_var = false,
           bool is_temp_var = false, bool is_phi_var = false)
      : ty(ty),
        is_memory_var(is_memory_var),
        is_temp_var(is_temp_var),
        is_phi_var(is_phi_var) {}